

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_storage.cpp
# Opt level: O2

void __thiscall
duckdb::InMemoryLogStorage::WriteLogEntry
          (InMemoryLogStorage *this,timestamp_t timestamp,LogLevel level,string *log_type,
          string *log_message,RegisteredLoggingContext *context)

{
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *this_00;
  idx_t iVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  data_ptr_t pdVar5;
  data_ptr_t pdVar6;
  iterator iVar7;
  pointer pDVar8;
  reference pvVar9;
  long lVar10;
  string_t sVar11;
  unique_lock<std::mutex> lck;
  string local_50;
  
  ::std::unique_lock<std::mutex>::unique_lock(&lck,&this->lock);
  iVar7 = ::std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&(this->registered_contexts)._M_h,&context->context_id);
  if (iVar7.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0) {
    WriteLoggingContext(this,context);
  }
  this_00 = &this->entry_buffer;
  pDVar8 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  iVar1 = pDVar8->count;
  pDVar8 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  pvVar9 = vector<duckdb::Vector,_true>::get<true>(&pDVar8->data,0);
  pdVar2 = pvVar9->data;
  pDVar8 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  pvVar9 = vector<duckdb::Vector,_true>::get<true>(&pDVar8->data,1);
  pdVar3 = pvVar9->data;
  pDVar8 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  pvVar9 = vector<duckdb::Vector,_true>::get<true>(&pDVar8->data,2);
  pdVar4 = pvVar9->data;
  pDVar8 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  pvVar9 = vector<duckdb::Vector,_true>::get<true>(&pDVar8->data,3);
  pdVar5 = pvVar9->data;
  pDVar8 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  pvVar9 = vector<duckdb::Vector,_true>::get<true>(&pDVar8->data,4);
  pdVar6 = pvVar9->data;
  *(idx_t *)(pdVar2 + iVar1 * 8) = context->context_id;
  *(int64_t *)(pdVar3 + iVar1 * 8) = timestamp.value;
  pDVar8 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  pvVar9 = vector<duckdb::Vector,_true>::get<true>(&pDVar8->data,2);
  sVar11 = StringVector::AddString(pvVar9,log_type);
  lVar10 = iVar1 * 0x10;
  *(long *)(pdVar4 + lVar10) = sVar11.value._0_8_;
  *(long *)(pdVar4 + lVar10 + 8) = sVar11.value._8_8_;
  pDVar8 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  pvVar9 = vector<duckdb::Vector,_true>::get<true>(&pDVar8->data,3);
  EnumUtil::ToString<duckdb::LogLevel>(&local_50,level);
  sVar11 = StringVector::AddString(pvVar9,&local_50);
  *(long *)(pdVar5 + lVar10) = sVar11.value._0_8_;
  *(long *)(pdVar5 + lVar10 + 8) = sVar11.value._8_8_;
  ::std::__cxx11::string::~string((string *)&local_50);
  pDVar8 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  pvVar9 = vector<duckdb::Vector,_true>::get<true>(&pDVar8->data,4);
  sVar11 = StringVector::AddString(pvVar9,log_message);
  *(long *)(pdVar6 + lVar10) = sVar11.value._0_8_;
  *(long *)(pdVar6 + lVar10 + 8) = sVar11.value._8_8_;
  pDVar8 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                     (this_00);
  pDVar8->count = iVar1 + 1;
  if (this->max_buffer_size <= iVar1 + 1) {
    FlushInternal(this);
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&lck);
  return;
}

Assistant:

void InMemoryLogStorage::WriteLogEntry(timestamp_t timestamp, LogLevel level, const string &log_type,
                                       const string &log_message, const RegisteredLoggingContext &context) {
	unique_lock<mutex> lck(lock);

	if (registered_contexts.find(context.context_id) == registered_contexts.end()) {
		WriteLoggingContext(context);
	}

	auto size = entry_buffer->size();
	auto context_id_data = FlatVector::GetData<idx_t>(entry_buffer->data[0]);
	auto timestamp_data = FlatVector::GetData<timestamp_t>(entry_buffer->data[1]);
	auto type_data = FlatVector::GetData<string_t>(entry_buffer->data[2]);
	auto level_data = FlatVector::GetData<string_t>(entry_buffer->data[3]);
	auto message_data = FlatVector::GetData<string_t>(entry_buffer->data[4]);

	context_id_data[size] = context.context_id;
	timestamp_data[size] = timestamp;
	type_data[size] = StringVector::AddString(entry_buffer->data[2], log_type);
	level_data[size] = StringVector::AddString(entry_buffer->data[3], EnumUtil::ToString(level));
	message_data[size] = StringVector::AddString(entry_buffer->data[4], log_message);

	entry_buffer->SetCardinality(size + 1);

	if (size + 1 >= max_buffer_size) {
		FlushInternal();
	}
}